

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.h
# Opt level: O0

void __thiscall LatencySimulator::clear(LatencySimulator *this)

{
  bool bVar1;
  reference ppDVar2;
  _Self local_40;
  _List_node_base *local_38;
  _List_node_base *local_30;
  _Self local_28;
  _List_node_base *local_20;
  _List_iterator<DelayPacket_*> local_18;
  iterator it;
  LatencySimulator *this_local;
  
  it._M_node = (_List_node_base *)this;
  std::_List_iterator<DelayPacket_*>::_List_iterator(&local_18);
  local_20 = (_List_node_base *)
             std::__cxx11::list<DelayPacket_*,_std::allocator<DelayPacket_*>_>::begin(&this->p12);
  local_18._M_node = local_20;
  while( true ) {
    local_28._M_node =
         (_List_node_base *)
         std::__cxx11::list<DelayPacket_*,_std::allocator<DelayPacket_*>_>::end(&this->p12);
    bVar1 = std::operator!=(&local_18,&local_28);
    if (!bVar1) break;
    ppDVar2 = std::_List_iterator<DelayPacket_*>::operator*(&local_18);
    if (*ppDVar2 != (DelayPacket *)0x0) {
      (*(*ppDVar2)->_vptr_DelayPacket[1])();
    }
    local_30 = (_List_node_base *)std::_List_iterator<DelayPacket_*>::operator++(&local_18,0);
  }
  local_38 = (_List_node_base *)
             std::__cxx11::list<DelayPacket_*,_std::allocator<DelayPacket_*>_>::begin(&this->p21);
  local_18._M_node = local_38;
  while( true ) {
    local_40._M_node =
         (_List_node_base *)
         std::__cxx11::list<DelayPacket_*,_std::allocator<DelayPacket_*>_>::end(&this->p21);
    bVar1 = std::operator!=(&local_18,&local_40);
    if (!bVar1) break;
    ppDVar2 = std::_List_iterator<DelayPacket_*>::operator*(&local_18);
    if (*ppDVar2 != (DelayPacket *)0x0) {
      (*(*ppDVar2)->_vptr_DelayPacket[1])();
    }
    std::_List_iterator<DelayPacket_*>::operator++(&local_18,0);
  }
  std::__cxx11::list<DelayPacket_*,_std::allocator<DelayPacket_*>_>::clear(&this->p12);
  std::__cxx11::list<DelayPacket_*,_std::allocator<DelayPacket_*>_>::clear(&this->p21);
  return;
}

Assistant:

void clear() {
        DelayTunnel::iterator it;
        for (it = p12.begin(); it != p12.end(); it++) {
            delete *it;
        }
        for (it = p21.begin(); it != p21.end(); it++) {
            delete *it;
        }
        p12.clear();
        p21.clear();
    }